

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg.c
# Opt level: O2

void tcg_reg_alloc_do_movi
               (TCGContext_conflict9 *s,TCGTemp *ots,tcg_target_ulong val,TCGLifeData arg_life,
               TCGRegSet preferred_regs)

{
  ulong uVar1;
  
  uVar1 = *(ulong *)ots;
  if (((uint)uVar1 & 0xff00) == 0x100) {
    s->reg_to_temp[uVar1 & 0xff] = (TCGTemp *)0x0;
    uVar1 = *(ulong *)ots;
  }
  ots->val = val;
  *(ulong *)ots = uVar1 & 0xfffffff7ffff00ff | 0x300;
  if ((arg_life & 1) == 0) {
    if ((arg_life & 4) == 0) {
      return;
    }
    temp_free_or_dead(s,ots,1);
    return;
  }
  temp_sync(s,ots,s->reserved_regs,preferred_regs,arg_life & 4);
  return;
}

Assistant:

static void tcg_reg_alloc_do_movi(TCGContext *s, TCGTemp *ots,
                                  tcg_target_ulong val, TCGLifeData arg_life,
                                  TCGRegSet preferred_regs)
{
    /* ENV should not be modified.  */
    tcg_debug_assert(!ots->fixed_reg);

    /* The movi is not explicitly generated here.  */
    if (ots->val_type == TEMP_VAL_REG) {
        s->reg_to_temp[ots->reg] = NULL;
    }
    ots->val_type = TEMP_VAL_CONST;
    ots->val = val;
    ots->mem_coherent = 0;
    if (NEED_SYNC_ARG(0)) {
        temp_sync(s, ots, s->reserved_regs, preferred_regs, IS_DEAD_ARG(0));
    } else if (IS_DEAD_ARG(0)) {
        temp_dead(s, ots);
    }
}